

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_tree.hpp
# Opt level: O1

void tao::pegtl::parse_tree::internal::make_control<queryparse::store,tao::pegtl::normal>::
     control<queryparse::ascii_char,true>::
     success<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,tao::pegtl::parse_tree::node>
               (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in,state<tao::pegtl::parse_tree::node> *state)

{
  pointer puVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_> *this
  ;
  type n;
  _Head_base<0UL,_tao::pegtl::parse_tree::node_*,_false> local_20;
  _Head_base<0UL,_tao::pegtl::parse_tree::node_*,_false> local_18;
  
  puVar1 = (state->stack).
           super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_20._M_head_impl =
       puVar1[-1]._M_t.
       super___uniq_ptr_impl<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
       ._M_t.
       super__Tuple_impl<0UL,_tao::pegtl::parse_tree::node_*,_std::default_delete<tao::pegtl::parse_tree::node>_>
       .super__Head_base<0UL,_tao::pegtl::parse_tree::node_*,_false>._M_head_impl;
  puVar1[-1]._M_t.
  super___uniq_ptr_impl<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
  ._M_t.
  super__Tuple_impl<0UL,_tao::pegtl::parse_tree::node_*,_std::default_delete<tao::pegtl::parse_tree::node>_>
  .super__Head_base<0UL,_tao::pegtl::parse_tree::node_*,_false>._M_head_impl = (node *)0x0;
  this = (state->stack).
         super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
  (state->stack).
  super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = this;
  std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
  ::~unique_ptr(this);
  pcVar2 = (in->
           super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .m_current.data;
  sVar3 = (in->
          super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_current.byte;
  sVar4 = (in->
          super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_current.byte_in_line;
  ((local_20._M_head_impl)->super_basic_node<tao::pegtl::parse_tree::node>).
  super_default_node_content.end_.line =
       (in->
       super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ).
       super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .m_current.line;
  ((local_20._M_head_impl)->super_basic_node<tao::pegtl::parse_tree::node>).
  super_default_node_content.end_.byte_in_line = sVar4;
  ((local_20._M_head_impl)->super_basic_node<tao::pegtl::parse_tree::node>).
  super_default_node_content.end_.data = pcVar2;
  ((local_20._M_head_impl)->super_basic_node<tao::pegtl::parse_tree::node>).
  super_default_node_content.end_.byte = sVar3;
  if (local_20._M_head_impl != (node *)0x0) {
    local_18._M_head_impl = local_20._M_head_impl;
    local_20._M_head_impl = (node *)0x0;
    std::
    vector<std::unique_ptr<tao::pegtl::parse_tree::node,std::default_delete<tao::pegtl::parse_tree::node>>,std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,std::default_delete<tao::pegtl::parse_tree::node>>>>
    ::
    emplace_back<std::unique_ptr<tao::pegtl::parse_tree::node,std::default_delete<tao::pegtl::parse_tree::node>>>
              ((vector<std::unique_ptr<tao::pegtl::parse_tree::node,std::default_delete<tao::pegtl::parse_tree::node>>,std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,std::default_delete<tao::pegtl::parse_tree::node>>>>
                *)(state->stack).
                  super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_tao::pegtl::parse_tree::node_*,_std::default_delete<tao::pegtl::parse_tree::node>_>
                  .super__Head_base<0UL,_tao::pegtl::parse_tree::node_*,_false>._M_head_impl,
               (unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                *)&local_18);
    std::
    unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>::
    ~unique_ptr((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                 *)&local_18);
  }
  std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
  ::~unique_ptr((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                 *)&local_20);
  return;
}

Assistant:

static void success( const Input& in, state< Node >& state, States&&... st )
               {
                  auto n = std::move( state.back() );
                  state.pop_back();
                  n->template success< Rule >( in, st... );
                  transform< Node, S< Rule > >::call( n, st... );
                  if( n ) {
                     state.back()->emplace_back( std::move( n ), st... );
                  }
               }